

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

void save_load(bfgs *b,io_buf *model_file,bool read,bool text)

{
  uint32_t uVar1;
  int iVar2;
  vw *all;
  bool bVar3;
  bool bVar4;
  float *pfVar5;
  double *pdVar6;
  ostream *poVar7;
  vw_exception *this;
  undefined7 in_register_00000009;
  int iVar8;
  undefined7 in_register_00000011;
  size_t nmemb;
  bool reg_vector;
  undefined4 local_1dc;
  string local_1d8;
  stringstream __msg;
  ostream local_1a8;
  
  all = b->all;
  if ((int)CONCAT71(in_register_00000011,read) == 0) {
    reg_vector = true;
    if (b->output_regularizer != false) goto LAB_0019baab;
  }
  else {
    local_1dc = (undefined4)CONCAT71(in_register_00000009,text);
    uVar1 = all->num_bits;
    initialize_regressor(all);
    bVar3 = std::operator!=(&all->per_feature_regularizer_input,"");
    if (bVar3) {
      pfVar5 = calloc_or_throw<float>((ulong)(uint)(2 << ((byte)uVar1 & 0x1f)));
      b->regularizers = pfVar5;
      if (pfVar5 == (float *)0x0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
        std::operator<<(&local_1a8,"Failed to allocate regularizers array: try decreasing -b <bits>"
                       );
        this = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/bfgs.cc"
                   ,0x40a,&local_1d8);
        __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
    iVar2 = b->m;
    nmemb = (size_t)iVar2;
    iVar8 = 1;
    if (nmemb != 0) {
      iVar8 = iVar2 * 2;
    }
    b->mem_stride = iVar8;
    pfVar5 = calloc_or_throw<float>((long)iVar8 << ((byte)all->num_bits & 0x3f));
    b->mem = pfVar5;
    pdVar6 = calloc_or_throw<double>(nmemb);
    b->rho = pdVar6;
    pdVar6 = calloc_or_throw<double>(nmemb);
    b->alpha = pdVar6;
    if (all->quiet == false) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"m = ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar2);
      poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
      poVar7 = std::operator<<(poVar7,"Allocated ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      poVar7 = std::operator<<(poVar7,"M for weights and mem");
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    b->net_time = 0.0;
    ftime(&b->t_start_global);
    if (all->quiet == false) {
      fprintf(_stderr,"%2s %-10s\t%-10s\t%-10s\t %-10s\t%-10s\t%-10s\t%-10s\t%-10s\t%-s\n","##",
              "avg. loss","der. mag.","d. m. cond.","wolfe1","wolfe2","mix fraction","curvature",
              "dir. magnitude","step size");
      *(undefined8 *)(fwrite + *(long *)(std::cerr + -0x18)) = 5;
    }
    if (b->regularizers != (weight *)0x0) {
      all->l2_lambda = 1.0;
    }
    bVar3 = std::operator!=(&all->per_feature_regularizer_output,"");
    bVar4 = true;
    text = SUB41(local_1dc,0);
    if (!bVar3) {
      bVar4 = std::operator!=(&all->per_feature_regularizer_text,"");
    }
    b->output_regularizer = bVar4;
    b->previous_loss_sum = 0.0;
    b->lastj = 0;
    b->origin = 0;
    b->loss_sum = 0.0;
    b->importance_weight_sum = 0.0;
    b->curvature = 0.0;
    b->first_pass = true;
    b->gradient_pass = true;
    b->preconditioner_pass = true;
  }
  reg_vector = (all->per_feature_regularizer_input)._M_string_length != 0 && read;
LAB_0019baab:
  if ((model_file->files)._end != (model_file->files)._begin) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    poVar7 = std::operator<<(&local_1a8,":");
    poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
    std::operator<<(poVar7,"\n");
    bin_text_read_write_fixed(model_file,&reg_vector,1,"",read,&__msg,text);
    if (reg_vector == true) {
      save_load_regularizer(all,b,model_file,read,text);
    }
    else {
      GD::save_load_regressor(all,model_file,read,text);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&__msg);
  }
  return;
}

Assistant:

void save_load(bfgs& b, io_buf& model_file, bool read, bool text)
{
  vw* all = b.all;

  uint32_t length = 1 << all->num_bits;

  if (read)
  {
    initialize_regressor(*all);
    if (all->per_feature_regularizer_input != "")
    {
      b.regularizers = calloc_or_throw<weight>(2 * length);
      if (b.regularizers == nullptr)
        THROW("Failed to allocate regularizers array: try decreasing -b <bits>");
    }
    int m = b.m;

    b.mem_stride = (m == 0) ? CG_EXTRA : 2 * m;
    b.mem = calloc_or_throw<float>(all->length() * b.mem_stride);
    b.rho = calloc_or_throw<double>(m);
    b.alpha = calloc_or_throw<double>(m);

    uint32_t stride_shift = all->weights.stride_shift();

    if (!all->quiet)
      cerr << "m = " << m << endl
           << "Allocated "
           << ((long unsigned int)all->length() * (sizeof(float) * (b.mem_stride) + (sizeof(weight) << stride_shift)) >>
                  20)
           << "M for weights and mem" << endl;

    b.net_time = 0.0;
    ftime(&b.t_start_global);

    if (!all->quiet)
    {
      const char* header_fmt = "%2s %-10s\t%-10s\t%-10s\t %-10s\t%-10s\t%-10s\t%-10s\t%-10s\t%-s\n";
      fprintf(stderr, header_fmt, "##", "avg. loss", "der. mag.", "d. m. cond.", "wolfe1", "wolfe2", "mix fraction",
          "curvature", "dir. magnitude", "step size");
      cerr.precision(5);
    }

    if (b.regularizers != nullptr)
      all->l2_lambda = 1;  // To make sure we are adding the regularization
    b.output_regularizer = (all->per_feature_regularizer_output != "" || all->per_feature_regularizer_text != "");
    reset_state(*all, b, false);
  }

  // bool reg_vector = b.output_regularizer || all->per_feature_regularizer_input.length() > 0;
  bool reg_vector = (b.output_regularizer && !read) || (all->per_feature_regularizer_input.length() > 0 && read);

  if (model_file.files.size() > 0)
  {
    stringstream msg;
    msg << ":" << reg_vector << "\n";
    bin_text_read_write_fixed(model_file, (char*)&reg_vector, sizeof(reg_vector), "", read, msg, text);

    if (reg_vector)
      save_load_regularizer(*all, b, model_file, read, text);
    else
      GD::save_load_regressor(*all, model_file, read, text);
  }
}